

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReshapeLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshapelike(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReshapeLikeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reshapelike(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reshapelike(this);
    this_00 = (ReshapeLikeLayerParams *)operator_new(0x18);
    ReshapeLikeLayerParams::ReshapeLikeLayerParams(this_00);
    (this->layer_).reshapelike_ = this_00;
  }
  return (ReshapeLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeLikeLayerParams* NeuralNetworkLayer::mutable_reshapelike() {
  if (!has_reshapelike()) {
    clear_layer();
    set_has_reshapelike();
    layer_.reshapelike_ = new ::CoreML::Specification::ReshapeLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshapeLike)
  return layer_.reshapelike_;
}